

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O2

void __thiscall
rsg::ConditionalStatement::tokenize
          (ConditionalStatement *this,GeneratorState *state,TokenStream *str)

{
  bool bVar1;
  TokenStream *pTVar2;
  long lVar3;
  _func_int **pp_Var4;
  Statement *pSVar5;
  Token local_40;
  Token local_30;
  
  local_40.m_type = IF;
  pTVar2 = TokenStream::operator<<(str,&local_40);
  local_30.m_type = LEFT_PAREN;
  TokenStream::operator<<(pTVar2,&local_30);
  Token::~Token(&local_30);
  Token::~Token(&local_40);
  (*this->m_condition->_vptr_Expression[3])(this->m_condition,state,str);
  local_40.m_type = RIGHT_PAREN;
  pTVar2 = TokenStream::operator<<(str,&local_40);
  local_30.m_type = NEWLINE;
  TokenStream::operator<<(pTVar2,&local_30);
  Token::~Token(&local_30);
  Token::~Token(&local_40);
  pSVar5 = this->m_trueStatement;
  bVar1 = anon_unknown_0::isBlockStatement(pSVar5);
  if (bVar1) {
    (*pSVar5->_vptr_Statement[3])(pSVar5,state,str);
  }
  else {
    local_40.m_type = INDENT_INC;
    TokenStream::operator<<(str,&local_40);
    Token::~Token(&local_40);
    (*this->m_trueStatement->_vptr_Statement[3])(this->m_trueStatement,state,str);
    local_40.m_type = INDENT_DEC;
    TokenStream::operator<<(str,&local_40);
    Token::~Token(&local_40);
  }
  if (this->m_falseStatement != (Statement *)0x0) {
    local_40.m_type = ELSE;
    TokenStream::operator<<(str,&local_40);
    Token::~Token(&local_40);
    pSVar5 = this->m_falseStatement;
    if ((pSVar5 == (Statement *)0x0) ||
       (lVar3 = __dynamic_cast(pSVar5,&Statement::typeinfo,&typeinfo,0), lVar3 == 0)) {
      bVar1 = anon_unknown_0::isBlockStatement(pSVar5);
      if (!bVar1) {
        local_40.m_type = NEWLINE;
        pTVar2 = TokenStream::operator<<(str,&local_40);
        local_30.m_type = INDENT_INC;
        TokenStream::operator<<(pTVar2,&local_30);
        Token::~Token(&local_30);
        Token::~Token(&local_40);
        (*this->m_falseStatement->_vptr_Statement[3])(this->m_falseStatement,state,str);
        local_40.m_type = INDENT_DEC;
        TokenStream::operator<<(str,&local_40);
        Token::~Token(&local_40);
        return;
      }
      local_40.m_type = NEWLINE;
      TokenStream::operator<<(str,&local_40);
      Token::~Token(&local_40);
      pSVar5 = this->m_falseStatement;
      pp_Var4 = pSVar5->_vptr_Statement;
    }
    else {
      pp_Var4 = pSVar5->_vptr_Statement;
    }
    (*pp_Var4[3])(pSVar5,state,str);
    return;
  }
  return;
}

Assistant:

void ConditionalStatement::tokenize (GeneratorState& state, TokenStream& str) const
{
	DE_ASSERT(m_condition && m_trueStatement);

	// if (condition)
	str << Token::IF << Token::LEFT_PAREN;
	m_condition->tokenize(state, str);
	str << Token::RIGHT_PAREN << Token::NEWLINE;

	// Statement executed if true
	if (!isBlockStatement(m_trueStatement))
	{
		str << Token::INDENT_INC;
		m_trueStatement->tokenize(state, str);
		str << Token::INDENT_DEC;
	}
	else
		m_trueStatement->tokenize(state, str);

	if (m_falseStatement)
	{
		str << Token::ELSE;

		if (isConditionalStatement(m_falseStatement))
		{
			m_falseStatement->tokenize(state, str);
		}
		else if (isBlockStatement(m_falseStatement))
		{
			str << Token::NEWLINE;
			m_falseStatement->tokenize(state, str);
		}
		else
		{
			str << Token::NEWLINE << Token::INDENT_INC;
			m_falseStatement->tokenize(state, str);
			str << Token::INDENT_DEC;
		}
	}
}